

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.hpp
# Opt level: O2

void Search::search_timer(position *p,limits *lims)

{
  uint uVar1;
  double dVar2;
  anon_class_4_1_a7caa8a3 sleep;
  anon_class_4_1_a7caa8a3 local_3c;
  clock local_38;
  double local_28;
  
  local_38._end.__d.__r = (duration)0;
  local_38._start.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  uVar1 = lims->movetime;
  local_28 = estimate_max_time(p,lims);
  local_3c.delay = 1;
  if (uVar1 == 0) {
    if (local_28 <= -1.0) {
      do {
        dVar2 = util::clock::elapsed_ms(&local_38);
        elapsed = dVar2 + elapsed;
        search_timer::anon_class_4_1_a7caa8a3::operator()(&local_3c);
        if (UCI_SIGNALS.stop != false) {
          UCI_SIGNALS.stop = true;
          return;
        }
      } while ((searching & 1) != 0);
    }
    else {
      do {
        dVar2 = util::clock::elapsed_ms(&local_38);
        elapsed = dVar2 + elapsed;
        search_timer::anon_class_4_1_a7caa8a3::operator()(&local_3c);
        if (UCI_SIGNALS.stop != false) {
          UCI_SIGNALS.stop = true;
          return;
        }
        if ((searching & 1) == 0) {
          UCI_SIGNALS.stop = true;
          return;
        }
      } while (elapsed <= local_28);
    }
  }
  else {
    do {
      dVar2 = util::clock::elapsed_ms(&local_38);
      elapsed = dVar2 + elapsed;
      search_timer::anon_class_4_1_a7caa8a3::operator()(&local_3c);
      if (UCI_SIGNALS.stop != false) {
        UCI_SIGNALS.stop = true;
        return;
      }
      if ((searching & 1) == 0) {
        UCI_SIGNALS.stop = true;
        return;
      }
    } while (elapsed <= (double)lims->movetime);
  }
  UCI_SIGNALS.stop = true;
  return;
}

Assistant:

void Search::search_timer(position& p, limits& lims) {
	util::clock c;
	c.start();
	bool fixed_time = lims.movetime > 0;
	int delay = 1; // ms
	double time_limit = estimate_max_time(p, lims);
	auto sleep = [delay]() { std::this_thread::sleep_for(std::chrono::milliseconds(delay)); };

	if (fixed_time) {
		do {
			elapsed += c.elapsed_ms();
			sleep();
		} while (!UCI_SIGNALS.stop && searching && elapsed <= lims.movetime);
	}
	else if (time_limit > -1) {
		// dynamic time estimate in a real game
		do {
			elapsed += c.elapsed_ms();
			sleep();
		} while (!UCI_SIGNALS.stop && searching && elapsed <= time_limit);
	}
	else {
		do {
			// analysis mode (infinite time)
			elapsed += c.elapsed_ms();
			sleep();
		} while (!UCI_SIGNALS.stop && searching);
	}
	UCI_SIGNALS.stop = true;
	return;
}